

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneContextMenuEvent::QGraphicsSceneContextMenuEvent
          (QGraphicsSceneContextMenuEvent *this,Type type)

{
  QGraphicsSceneEventPrivate *dd;
  
  dd = (QGraphicsSceneEventPrivate *)operator_new(0x50);
  dd->timestamp = 0;
  dd->widget = (QWidget *)0x0;
  dd->q_ptr = (QGraphicsSceneEvent *)0x0;
  dd->_vptr_QGraphicsSceneEventPrivate = (_func_int **)&PTR__QGraphicsSceneEventPrivate_007ede28;
  dd[1]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  dd[1].widget = (QWidget *)0x0;
  dd[1].q_ptr = (QGraphicsSceneEvent *)0x0;
  dd[1].timestamp = 0;
  *(undefined8 *)((long)&dd[1].timestamp + 4) = 0;
  *(undefined8 *)((long)&dd[2]._vptr_QGraphicsSceneEventPrivate + 4) = 0;
  *(undefined4 *)((long)&dd[2].widget + 4) = 2;
  QGraphicsSceneEvent::QGraphicsSceneEvent(&this->super_QGraphicsSceneEvent,dd,type);
  *(undefined ***)&this->super_QGraphicsSceneEvent = &PTR__QGraphicsSceneHelpEvent_007edb90;
  return;
}

Assistant:

QGraphicsSceneContextMenuEvent::QGraphicsSceneContextMenuEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneContextMenuEventPrivate, type)
{
}